

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.hpp
# Opt level: O0

bool __thiscall
Diligent::DeviceObjectArchive::ResourceData::operator==(ResourceData *this,ResourceData *Other)

{
  bool bVar1;
  size_type sVar2;
  const_reference this_00;
  const_reference Rhs;
  ulong local_28;
  size_t i;
  ResourceData *Other_local;
  ResourceData *this_local;
  
  bVar1 = SerializedData::operator!=(&this->Common,&Other->Common);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    for (local_28 = 0;
        sVar2 = std::array<Diligent::SerializedData,_7UL>::size(&this->DeviceSpecific),
        local_28 < sVar2; local_28 = local_28 + 1) {
      this_00 = std::array<Diligent::SerializedData,_7UL>::operator[]
                          (&this->DeviceSpecific,local_28);
      Rhs = std::array<Diligent::SerializedData,_7UL>::operator[](&Other->DeviceSpecific,local_28);
      bVar1 = SerializedData::operator!=(this_00,Rhs);
      if (bVar1) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool operator==(const ResourceData& Other) const noexcept
        {
            if (Common != Other.Common)
                return false;

            for (size_t i = 0; i < DeviceSpecific.size(); ++i)
            {
                if (DeviceSpecific[i] != Other.DeviceSpecific[i])
                    return false;
            }

            return true;
        }